

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O3

void __thiscall
TPZMatrixSolver<float>::UpdateFrom
          (TPZMatrixSolver<float> *this,TPZAutoPointer<TPZBaseMatrix> *mat_base)

{
  TPZReference *pTVar1;
  TPZMatrix<float> *pTVar2;
  TPZAutoPointer<TPZMatrix<float>_> matrix;
  TPZAutoPointer<TPZBaseMatrix> local_20;
  TPZAutoPointer<TPZMatrix<float>_> local_18;
  TPZAutoPointer<TPZBaseMatrix> local_10;
  
  local_10 = (TPZAutoPointer<TPZBaseMatrix>)mat_base->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAutoPointerDynamicCast<TPZMatrix<float>,TPZBaseMatrix>(&local_20);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_10);
  pTVar1 = (this->fReferenceMatrix).fRef;
  if ((((pTVar1 != (TPZReference *)0x0) && (local_20.fRef != (TPZReference *)0x0)) &&
      (pTVar1->fPointer != (TPZMatrix<float> *)0x0)) &&
     ((((local_20.fRef)->fPointer != (TPZBaseMatrix *)0x0 &&
       (pTVar1 = (this->fContainer).fRef, pTVar1 != (TPZReference *)0x0)) &&
      (pTVar2 = pTVar1->fPointer, pTVar2 != (TPZMatrix<float> *)0x0)))) {
    local_18.fRef = (TPZReference *)local_20.fRef;
    LOCK();
    ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x35])();
    TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(&local_18);
  }
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<float>_> *)&local_20)
  ;
  return;
}

Assistant:

virtual void UpdateFrom(TPZAutoPointer<TPZBaseMatrix> mat_base)
	{
        auto matrix =
            TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(mat_base);
		if (fReferenceMatrix == matrix && matrix)
		{
			if(this->fContainer) this->fContainer->UpdateFrom(matrix);
		}
	}